

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

_Bool rsa1_save_f(Filename *filename,RSAKey *key,char *passphrase)

{
  size_t sVar1;
  int iVar2;
  FILE *__s;
  strbuf *buf_o;
  size_t sVar3;
  _Bool _Var4;
  
  __s = (FILE *)f_open(filename,"wb",true);
  if (__s == (FILE *)0x0) {
    _Var4 = false;
  }
  else {
    buf_o = rsa1_save_sb(key,passphrase);
    sVar3 = fwrite(buf_o->s,1,buf_o->len,__s);
    sVar1 = buf_o->len;
    iVar2 = fclose(__s);
    _Var4 = iVar2 == 0 && sVar3 == sVar1;
    strbuf_free(buf_o);
  }
  return _Var4;
}

Assistant:

bool rsa1_save_f(const Filename *filename, RSAKey *key, const char *passphrase)
{
    FILE *fp = f_open(filename, "wb", true);
    if (!fp)
        return false;

    strbuf *buf = rsa1_save_sb(key, passphrase);
    bool toret = fwrite(buf->s, 1, buf->len, fp) == buf->len;
    if (fclose(fp))
        toret = false;
    strbuf_free(buf);
    return toret;
}